

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall RangeIterator::SeekBeyond(RangeIterator *this,RangeIterator_conflict *target)

{
  ulong uVar1;
  RangeNode *pRVar2;
  
  uVar1 = (target->range_max_).id_;
  MutableS2ShapeIndex::Iterator::Seek((Iterator *)this,(S2CellId)(uVar1 + (-uVar1 & uVar1) * 2));
  pRVar2 = (this->it_)._M_current;
  if ((pRVar2 != (RangeNode *)0xffffffffffffffff) &&
     ((long)pRVar2 - (~(ulong)pRVar2 & (ulong)((long)&pRVar2[-1].contents + 3U)) <=
      (target->range_max_).id_)) {
    MutableS2ShapeIndex::Iterator::Next((Iterator *)this);
  }
  Refresh((RangeIterator_conflict *)this);
  return;
}

Assistant:

void SeekBeyond(const RangeIterator& target) {
    it_.Seek(target.range_max().next());
    if (!it_.done() && it_.id().range_min() <= target.range_max()) {
      it_.Next();
    }
    Refresh();
  }